

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightBounds * __thiscall
pbrt::ProjectionLight::Bounds(LightBounds *__return_storage_ptr__,ProjectionLight *this)

{
  Image *this_00;
  Point2i p;
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  Float FVar11;
  Float FVar12;
  float __x;
  float fVar13;
  undefined1 auVar14 [64];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 extraout_var [60];
  
  TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar6.y < 1) {
    fVar13 = 0.0;
  }
  else {
    this_00 = &this->image;
    fVar13 = 0.0;
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (0 < TVar6.x) {
        lVar7 = 0;
        do {
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar8 + lVar7);
          FVar11 = Image::GetChannel(this_00,p,0,(WrapMode2D)0x200000002);
          FVar12 = Image::GetChannel(this_00,p,1,(WrapMode2D)0x200000002);
          auVar14._0_4_ = Image::GetChannel(this_00,p,2,(WrapMode2D)0x200000002);
          auVar14._4_60_ = extraout_var;
          TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
          lVar7 = lVar7 + 1;
          auVar21 = vmaxss_avx(ZEXT416((uint)FVar12),ZEXT416((uint)FVar11));
          auVar21 = vmaxss_avx(auVar14._0_16_,auVar21);
          fVar13 = fVar13 + auVar21._0_4_;
        } while (lVar7 < TVar6.x);
      }
      lVar8 = lVar8 + 0x100000000;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (long)TVar6 >> 0x20);
  }
  auVar18 = ZEXT816(0) << 0x40;
  fVar1 = this->scale;
  fVar19 = (this->super_LightBase).renderFromLight.m.m[2][2];
  FVar11 = (this->super_LightBase).renderFromLight.m.m[1][2];
  auVar21 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar18,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar16 = vfmadd231ss_fma(auVar16,auVar18,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  auVar22 = ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]);
  fVar15 = auVar16._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar3 = fVar15 == 1.0;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar18,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]
                                            ));
  auVar16 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar19),auVar17);
  fVar4 = auVar16._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  fVar10 = (float)((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar15));
  auVar16 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  fVar19 = fVar19 + auVar17._0_4_;
  auVar20._0_12_ = ZEXT812(0);
  auVar20._12_4_ = 0;
  auVar17._0_4_ = auVar21._0_4_ * 0.0;
  auVar17._4_4_ = auVar21._4_4_ * 0.0;
  auVar17._8_4_ = auVar21._8_4_ * 0.0;
  auVar17._12_4_ = auVar21._12_4_ * 0.0;
  auVar17 = vfmadd213ps_fma(auVar16,auVar20,auVar17);
  auVar21 = vfmadd213ss_fma(ZEXT816(0) << 0x20,auVar22,auVar17);
  fVar4 = auVar21._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar21 = vmovshdup_avx(auVar17);
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)FVar11),auVar18);
  fVar5 = auVar21._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  __x = acosf(this->cosTotalWidth);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar10;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar10;
  auVar21 = vinsertps_avx(ZEXT416((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar15)),
                          ZEXT416((uint)bVar3 * (int)fVar5 + (uint)!bVar3 * (int)(fVar5 / fVar15)),
                          0x10);
  auVar16 = vinsertps_avx(auVar22,ZEXT416((uint)FVar11),0x10);
  uVar2 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  uVar2 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  local_58 = auVar17._0_4_;
  fStack_54 = auVar17._4_4_;
  fStack_50 = auVar17._8_4_;
  fStack_4c = auVar17._12_4_;
  auVar18._0_4_ = auVar16._0_4_ + local_58;
  auVar18._4_4_ = auVar16._4_4_ + fStack_54;
  auVar18._8_4_ = auVar16._8_4_ + fStack_50;
  auVar18._12_4_ = auVar16._12_4_ + fStack_4c;
  auVar21._0_4_ = auVar18._0_4_ * auVar18._0_4_;
  auVar21._4_4_ = auVar18._4_4_ * auVar18._4_4_;
  auVar21._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar21._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar21 = vmovshdup_avx(auVar21);
  auVar21 = vfmadd231ss_fma(auVar21,auVar18,auVar18);
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  auVar21 = vsqrtss_avx(auVar21,auVar21);
  fVar15 = auVar21._0_4_;
  auVar22._4_4_ = fVar15;
  auVar22._0_4_ = fVar15;
  auVar22._8_4_ = fVar15;
  auVar22._12_4_ = fVar15;
  fVar19 = fVar19 / fVar15;
  auVar21 = vdivps_avx(auVar18,auVar22);
  auVar16._0_4_ = auVar21._0_4_ * auVar21._0_4_;
  auVar16._4_4_ = auVar21._4_4_ * auVar21._4_4_;
  auVar16._8_4_ = auVar21._8_4_ * auVar21._8_4_;
  auVar16._12_4_ = auVar21._12_4_ * auVar21._12_4_;
  auVar16 = vmovshdup_avx(auVar16);
  auVar16 = vfmadd231ss_fma(auVar16,auVar21,auVar21);
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar15 = auVar16._0_4_;
  auVar23._4_4_ = fVar15;
  auVar23._0_4_ = fVar15;
  auVar23._8_4_ = fVar15;
  auVar23._12_4_ = fVar15;
  auVar21 = vdivps_avx(auVar21,auVar23);
  uVar2 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = fVar19 / fVar15;
  __return_storage_ptr__->phi = (fVar13 * fVar1) / (float)(TVar6.x * TVar6.y);
  __return_storage_ptr__->theta_o = 0.0;
  __return_storage_ptr__->theta_e = __x;
  __return_storage_ptr__->cosTheta_o = 1.0;
  fVar13 = cosf(__x);
  __return_storage_ptr__->cosTheta_e = fVar13;
  __return_storage_ptr__->twoSided = false;
  return __return_storage_ptr__;
}

Assistant:

LightBounds ProjectionLight::Bounds() const {
#if 0
    // Along the lines of Phi()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp({(u + .5f) / image.Resolution().x,
                                            (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);
            sum += image.GetChannels({u, v}, rgbChannelDesc).MaxValue() * dwdA;
        }
    Float phi = scale * A * sum / (image.Resolution().x * image.Resolution().y);
#else
    // See comment in SpotLight::Bounds()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u)
            sum += std::max({image.GetChannel({u, v}, 0), image.GetChannel({u, v}, 1),
                             image.GetChannel({u, v}, 2)});
    Float phi = scale * sum / (image.Resolution().x * image.Resolution().y);
#endif
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    return LightBounds(p, w, phi, 0.f, std::acos(cosTotalWidth), false);
}